

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapOrSetDataList.h
# Opt level: O1

MapOrSetDataNode<void_*> * __thiscall
Js::MapOrSetDataList<void_*>::Append(MapOrSetDataList<void_*> *this,void **data,Recycler *recycler)

{
  Type *addr;
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  Recycler *alloc;
  MapOrSetDataNode<void_*> *pMVar4;
  undefined4 *puVar5;
  MapOrSetDataNode<void_*> *pMVar6;
  undefined1 local_58 [8];
  TrackAllocData data_1;
  
  local_58 = (undefined1  [8])&MapOrSetDataNode<void*>::typeinfo;
  data_1.typeinfo = (type_info *)0x0;
  data_1.plusSize = 0xffffffffffffffff;
  data_1.count = (size_t)anon_var_dwarf_3d92f3e;
  data_1.filename._0_4_ = 0x92;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
  pMVar4 = (MapOrSetDataNode<void_*> *)new<Memory::Recycler>(0x18,alloc,0x38bbb2);
  (pMVar4->next).ptr = (MapOrSetDataNode<void_*> *)0x0;
  (pMVar4->prev).ptr = (MapOrSetDataNode<void_*> *)0x0;
  pvVar1 = *data;
  Memory::Recycler::WBSetBit((char *)&pMVar4->data);
  (pMVar4->data).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pMVar4->data);
  addr = &this->last;
  pMVar6 = (this->last).ptr;
  if (pMVar6 == (MapOrSetDataNode<void_*> *)0x0) {
    pMVar6 = (MapOrSetDataNode<void_*> *)this;
    if ((this->first).ptr != (MapOrSetDataNode<void_*> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                  ,0x96,"(first == nullptr)","first == nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else {
    Memory::Recycler::WBSetBit((char *)&pMVar4->prev);
    (pMVar4->prev).ptr = pMVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pMVar4->prev);
    pMVar6 = addr->ptr;
  }
  Memory::Recycler::WBSetBit((char *)pMVar6);
  (pMVar6->next).ptr = pMVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pMVar6);
  Memory::Recycler::WBSetBit((char *)addr);
  (this->last).ptr = pMVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return pMVar4;
}

Assistant:

MapOrSetDataNode<TData>* Append(TData& data, Recycler* recycler)
        {
            // Must allocate with the recycler so that iterators can continue
            // to point to removed nodes.  That is, cannot delete nodes when
            // they are removed.  Reference counting would also work.
            MapOrSetDataNode<TData>* newNode = RecyclerNew(recycler, MapOrSetDataNode<TData>, data);

            if (last == nullptr)
            {
                Assert(first == nullptr);
                first = newNode;
                last = newNode;
            }
            else
            {
                newNode->prev = last;
                last->next = newNode;
                last = newNode;
            }

            return newNode;
        }